

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Serial.cpp
# Opt level: O0

bool __thiscall axl::io::Serial::getSettings(Serial *this,SerialSettings *settings)

{
  bool bVar1;
  bool result;
  termios attr;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Serial *in_stack_ffffffffffffffb0;
  termios *in_stack_ffffffffffffffc8;
  SerialSettings *in_stack_ffffffffffffffd0;
  
  bVar1 = psx::Serial::getAttr
                    (in_stack_ffffffffffffffb0,
                     (termios *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (bVar1) {
    SerialSettings::setAttr(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return bVar1;
}

Assistant:

bool
Serial::getSettings(SerialSettings* settings) {
	termios attr;
	bool result = m_serial.getAttr(&attr);
	if (!result)
		return false;

	settings->setAttr(&attr);
	return true;
}